

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_generator_testing.h
# Opt level: O0

pair<const_int,_phmap::priv::NonStandardLayout> * __thiscall
phmap::priv::hash_internal::Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void>::
operator()(pair<const_int,_phmap::priv::NonStandardLayout> *__return_storage_ptr__,
          Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void> *this)

{
  Generator<phmap::priv::NonStandardLayout,_void> local_49;
  NonStandardLayout local_48;
  Generator<int,_void> local_1d;
  int local_1c;
  Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void> *local_18;
  Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void> *this_local;
  
  local_18 = this;
  this_local = (Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void> *)
               __return_storage_ptr__;
  local_1c = Generator<int,_void>::operator()(&local_1d);
  Generator<phmap::priv::NonStandardLayout,_void>::operator()(&local_48,&local_49);
  std::pair<const_int,_phmap::priv::NonStandardLayout>::
  pair<int,_phmap::priv::NonStandardLayout,_true>(__return_storage_ptr__,&local_1c,&local_48);
  NonStandardLayout::~NonStandardLayout(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::pair<K, V> operator()() const {
        return std::pair<K, V>(Generator<typename std::decay<K>::type>()(),
                               Generator<typename std::decay<V>::type>()());
    }